

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O1

SI_Error __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Save
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,
          OutputWriter *a_oOutput,bool a_bAddSignature)

{
  list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
  *a_names;
  char cVar1;
  list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
  *plVar2;
  list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
  *plVar3;
  list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
  *plVar4;
  bool bVar5;
  bool bVar6;
  _List_node_base *p_Var7;
  ulong uVar8;
  _List_node_base *p_Var9;
  SI_Error SVar10;
  char *pcVar11;
  _List_node_base *p_Var12;
  Converter convert;
  TNamesDepend oValues;
  TNamesDepend oKeys;
  TNamesDepend oSections;
  Converter local_a0;
  _List_node_base local_78;
  undefined8 local_68;
  list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
  *local_60;
  list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
  *local_58;
  undefined8 local_50;
  _List_node_base local_48;
  undefined8 local_38;
  
  Converter::Converter(&local_a0,this->m_bStoreIsUtf8);
  if ((a_bAddSignature & this->m_bStoreIsUtf8) == 1) {
    (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,anon_var_dwarf_8efb8);
  }
  local_48._M_next = &local_48;
  local_38 = 0;
  local_48._M_prev = local_48._M_next;
  GetAllSections(this,(TNamesDepend *)local_48._M_next);
  p_Var9 = &local_48;
  std::__cxx11::
  list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
  ::sort<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::LoadOrder>
            ((list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
              *)p_Var9);
  if (this->m_pFileComment == (char *)0x0) {
    bVar6 = false;
  }
  else {
    bVar5 = OutputMultiLineText(this,a_oOutput,&local_a0,this->m_pFileComment);
    SVar10 = SI_FAIL;
    bVar6 = true;
    if (!bVar5) goto LAB_001f9828;
  }
  a_names = (list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
             *)&local_60;
LAB_001f94e5:
  p_Var9 = p_Var9->_M_next;
  if (p_Var9 == &local_48) {
    SVar10 = SI_OK;
    (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
    goto LAB_001f9828;
  }
  if (p_Var9[1]._M_prev != (_List_node_base *)0x0) {
    if (bVar6) {
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
    }
    bVar6 = OutputMultiLineText(this,a_oOutput,&local_a0,(char *)p_Var9[1]._M_prev);
    if (!bVar6) goto LAB_001f980f;
    bVar6 = false;
  }
  if (bVar6) {
    (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
    (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
    bVar6 = false;
  }
  if (*(char *)&(p_Var9[1]._M_next)->_M_next != '\0') {
    bVar5 = Converter::ConvertToStore(&local_a0,(char *)p_Var9[1]._M_next);
    if (!bVar5) goto LAB_001f980f;
    (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"[");
    (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,local_a0.m_scratch._M_dataplus._M_p);
    (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"]");
    (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
  }
  local_50 = 0;
  local_60 = a_names;
  local_58 = a_names;
  GetAllKeys(this,(char *)p_Var9[1]._M_next,(TNamesDepend *)a_names);
  std::__cxx11::
  list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
  ::sort<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::LoadOrder>(a_names);
  for (plVar2 = local_60; plVar2 != a_names;
      plVar2 = *(list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
                 **)plVar2) {
    local_68 = 0;
    local_78._M_next = &local_78;
    local_78._M_prev = &local_78;
    GetAllValues(this,(char *)p_Var9[1]._M_next,*(char **)(plVar2 + 0x10),(TNamesDepend *)&local_78)
    ;
    p_Var12 = &local_78;
    while (p_Var12 = (((_List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                        *)&p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var7 = local_78._M_next, p_Var12 != &local_78) {
      if (p_Var12[1]._M_prev != (_List_node_base *)0x0) {
        (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
        bVar5 = OutputMultiLineText(this,a_oOutput,&local_a0,(char *)p_Var12[1]._M_prev);
        p_Var7 = local_78._M_next;
        if (!bVar5) goto joined_r0x001f97ca;
      }
      bVar5 = Converter::ConvertToStore(&local_a0,*(char **)(plVar2 + 0x10));
      p_Var7 = local_78._M_next;
      if (!bVar5) goto joined_r0x001f97ca;
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,local_a0.m_scratch._M_dataplus._M_p);
      bVar5 = Converter::ConvertToStore(&local_a0,(char *)p_Var12[1]._M_next);
      p_Var7 = local_78._M_next;
      if (!bVar5) goto joined_r0x001f97ca;
      pcVar11 = "=";
      if (this->m_bSpaces != false) {
        pcVar11 = " = ";
      }
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,pcVar11);
      if (this->m_bAllowMultiLine == true) {
        p_Var7 = p_Var12[1]._M_next;
        uVar8 = (ulong)*(byte *)&p_Var7->_M_next;
        if (uVar8 < 0x21) {
          if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
            if (uVar8 == 0) goto LAB_001f9731;
            goto LAB_001f9757;
          }
        }
        else {
LAB_001f9757:
          for (; cVar1 = *(char *)&p_Var7->_M_next, cVar1 != '\0';
              p_Var7 = (_List_node_base *)((long)&p_Var7->_M_next + 1)) {
            if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_001f96ee;
          }
          uVar8 = (ulong)*(byte *)((long)&p_Var7[-1]._M_prev + 7);
          if ((0x20 < uVar8) || ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0)) goto LAB_001f9731;
        }
LAB_001f96ee:
        (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"<<<END_OF_TEXT\n");
        bVar5 = OutputMultiLineText(this,a_oOutput,&local_a0,(char *)p_Var12[1]._M_next);
        p_Var7 = local_78._M_next;
        if (!bVar5) goto joined_r0x001f97ca;
        (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"END_OF_TEXT");
      }
      else {
LAB_001f9731:
        (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,local_a0.m_scratch._M_dataplus._M_p);
      }
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
    }
    while (p_Var7 != &local_78) {
      p_Var12 = p_Var7->_M_next;
      operator_delete(p_Var7);
      p_Var7 = p_Var12;
    }
  }
  bVar6 = true;
  plVar4 = local_60;
  goto joined_r0x001f97e9;
joined_r0x001f97ca:
  while (plVar4 = local_60, p_Var7 != &local_78) {
    p_Var12 = p_Var7->_M_next;
    operator_delete(p_Var7);
    p_Var7 = p_Var12;
  }
joined_r0x001f97e9:
  while (plVar4 != a_names) {
    plVar3 = *(list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
               **)plVar4;
    operator_delete(plVar4);
    plVar4 = plVar3;
  }
  if (plVar2 != a_names) goto LAB_001f980f;
  goto LAB_001f94e5;
LAB_001f980f:
  SVar10 = SI_FAIL;
LAB_001f9828:
  p_Var9 = local_48._M_next;
  while (p_Var9 != &local_48) {
    p_Var12 = (((_List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                 *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var9);
    p_Var9 = p_Var12;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_scratch._M_dataplus._M_p != &local_a0.m_scratch.field_2) {
    operator_delete(local_a0.m_scratch._M_dataplus._M_p);
  }
  return SVar10;
}

Assistant:

SI_Error
CSimpleIniTempl<SI_CHAR,SI_STRLESS,SI_CONVERTER>::Save(
    OutputWriter &  a_oOutput,
    bool            a_bAddSignature
    ) const
{
    Converter convert(m_bStoreIsUtf8);

    // add the UTF-8 signature if it is desired
    if (m_bStoreIsUtf8 && a_bAddSignature) {
        a_oOutput.Write(SI_UTF8_SIGNATURE);
    }

    // get all of the sections sorted in load order
    TNamesDepend oSections;
    GetAllSections(oSections);
#if defined(_MSC_VER) && _MSC_VER <= 1200
    oSections.sort();
#elif defined(__BORLANDC__)
    oSections.sort(Entry::LoadOrder());
#else
    oSections.sort(typename Entry::LoadOrder());
#endif

    // write the file comment if we have one
    bool bNeedNewLine = false;
    if (m_pFileComment) {
        if (!OutputMultiLineText(a_oOutput, convert, m_pFileComment)) {
            return SI_FAIL;
        }
        bNeedNewLine = true;
    }

    // iterate through our sections and output the data
    typename TNamesDepend::const_iterator iSection = oSections.begin();
    for ( ; iSection != oSections.end(); ++iSection ) {
        // write out the comment if there is one
        if (iSection->pComment) {
            if (bNeedNewLine) {
                a_oOutput.Write(SI_NEWLINE_A);
                a_oOutput.Write(SI_NEWLINE_A);
            }
            if (!OutputMultiLineText(a_oOutput, convert, iSection->pComment)) {
                return SI_FAIL;
            }
            bNeedNewLine = false;
        }

        if (bNeedNewLine) {
            a_oOutput.Write(SI_NEWLINE_A);
            a_oOutput.Write(SI_NEWLINE_A);
            bNeedNewLine = false;
        }

        // write the section (unless there is no section name)
        if (*iSection->pItem) {
            if (!convert.ConvertToStore(iSection->pItem)) {
                return SI_FAIL;
            }
            a_oOutput.Write("[");
            a_oOutput.Write(convert.Data());
            a_oOutput.Write("]");
            a_oOutput.Write(SI_NEWLINE_A);
        }

        // get all of the keys sorted in load order
        TNamesDepend oKeys;
        GetAllKeys(iSection->pItem, oKeys);
#if defined(_MSC_VER) && _MSC_VER <= 1200
        oKeys.sort();
#elif defined(__BORLANDC__)
        oKeys.sort(Entry::LoadOrder());
#else
        oKeys.sort(typename Entry::LoadOrder());
#endif

        // write all keys and values
        typename TNamesDepend::const_iterator iKey = oKeys.begin();
        for ( ; iKey != oKeys.end(); ++iKey) {
            // get all values for this key
            TNamesDepend oValues;
            GetAllValues(iSection->pItem, iKey->pItem, oValues);

            typename TNamesDepend::const_iterator iValue = oValues.begin();
            for ( ; iValue != oValues.end(); ++iValue) {
                // write out the comment if there is one
                if (iValue->pComment) {
                    a_oOutput.Write(SI_NEWLINE_A);
                    if (!OutputMultiLineText(a_oOutput, convert, iValue->pComment)) {
                        return SI_FAIL;
                    }
                }

                // write the key
                if (!convert.ConvertToStore(iKey->pItem)) {
                    return SI_FAIL;
                }
                a_oOutput.Write(convert.Data());

                // write the value
                if (!convert.ConvertToStore(iValue->pItem)) {
                    return SI_FAIL;
                }
                a_oOutput.Write(m_bSpaces ? " = " : "=");
                if (m_bAllowMultiLine && IsMultiLineData(iValue->pItem)) {
                    // multi-line data needs to be processed specially to ensure
                    // that we use the correct newline format for the current system
                    a_oOutput.Write("<<<END_OF_TEXT" SI_NEWLINE_A);
                    if (!OutputMultiLineText(a_oOutput, convert, iValue->pItem)) {
                        return SI_FAIL;
                    }
                    a_oOutput.Write("END_OF_TEXT");
                }
                else {
                    a_oOutput.Write(convert.Data());
                }
                a_oOutput.Write(SI_NEWLINE_A);
            }
        }

        bNeedNewLine = true;
    }
    
    // Append new empty line
    a_oOutput.Write(SI_NEWLINE_A);

    return SI_OK;
}